

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_nojit.c
# Opt level: O0

void raviV_dumpIR(lua_State *L,Proto *p)

{
  _Bool _Var1;
  ravi_compile_options_t local_60;
  ravi_compile_options_t options;
  char fname [30];
  undefined1 local_30 [8];
  membuff_t buf;
  Proto *p_local;
  lua_State *L_local;
  
  buf.pos = (size_t)p;
  membuff_init((membuff_t *)local_30,0x1000);
  snprintf((char *)&options,0x1e,"jitfunction");
  local_60 = (ravi_compile_options_t)0x300000000;
  _Var1 = raviJ_codegen(L,(Proto *)buf.pos,&local_60,(char *)&options,(membuff_t *)local_30);
  if (_Var1) {
    puts((char *)local_30);
  }
  membuff_free((membuff_t *)local_30);
  return;
}

Assistant:

void raviV_dumpIR(struct lua_State *L, struct Proto *p) {
  membuff_t buf;
  membuff_init(&buf, 4096);

  // TODO enhance this to allow user to specify name
  // and also whether to dump header or body or both
  char fname[30];
  snprintf(fname, sizeof fname, "jitfunction");
  ravi_compile_options_t options = {0, 0, 0, RAVI_CODEGEN_ALL};
  if (raviJ_codegen(L, p, &options, fname, &buf)) { puts(buf.buf); }
  membuff_free(&buf);
}